

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O1

bool wasm::PossibleContents::haveIntersection(PossibleContents *a,PossibleContents *b)

{
  __index_type _Var1;
  __index_type _Var2;
  bool bVar3;
  bool bVar4;
  BasicHeapType BVar5;
  BasicHeapType BVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  ConeType CVar10;
  Type local_50;
  Type aType;
  Type bType;
  HeapType aHeapType;
  HeapType bHeapType;
  
  _Var1 = *(__index_type *)
           ((long)&(a->value).
                   super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                   .
                   super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
           + 0x18);
  if ((_Var1 != '\0') &&
     (_Var2 = *(__index_type *)
               ((long)&(b->value).
                       super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       .
                       super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       .
                       super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       .
                       super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       .
                       super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                       .
                       super__Variant_storage_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               + 0x18), _Var2 != '\0')) {
    if (_Var2 == '\x04' || _Var1 == '\x04') {
      return true;
    }
    local_50 = getType(a);
    aType = getType(b);
    bVar3 = wasm::Type::isRef(&local_50);
    if ((!bVar3) || (bVar3 = wasm::Type::isRef(&aType), !bVar3)) {
      return local_50.id == aType.id;
    }
    bType.id = (uintptr_t)wasm::Type::getHeapType(&local_50);
    aHeapType = wasm::Type::getHeapType(&aType);
    bVar3 = wasm::Type::isNullable(&local_50);
    if ((bVar3) && (bVar3 = wasm::Type::isNullable(&aType), bVar3)) {
      BVar5 = HeapType::getBottom((HeapType *)&bType);
      BVar6 = HeapType::getBottom(&aHeapType);
      if (BVar5 == BVar6) {
        return true;
      }
    }
    bVar3 = isNull(a);
    if ((!bVar3) && (bVar3 = isNull(b), !bVar3)) {
      bVar3 = HeapType::isSubType((HeapType)bType.id,aHeapType);
      bVar4 = HeapType::isSubType(aHeapType,(HeapType)bType.id);
      if (bVar3 || bVar4) {
        sVar7 = HeapType::getDepth((HeapType *)&bType);
        sVar8 = HeapType::getDepth(&aHeapType);
        if (bVar3) {
          uVar9 = sVar7 - sVar8;
          if (sVar7 < sVar8) {
            __assert_fail("aDepthFromRoot >= bDepthFromRoot",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                          ,0x152,
                          "static bool wasm::PossibleContents::haveIntersection(const PossibleContents &, const PossibleContents &)"
                         );
          }
        }
        else {
          if (!bVar4) {
            handle_unreachable("we ruled out no subtyping before",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                               ,0x158);
          }
          uVar9 = sVar8 - sVar7;
          b = a;
          if (sVar8 < sVar7) {
            __assert_fail("bDepthFromRoot >= aDepthFromRoot",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                          ,0x155,
                          "static bool wasm::PossibleContents::haveIntersection(const PossibleContents &, const PossibleContents &)"
                         );
          }
        }
        CVar10 = getCone(b);
        return uVar9 <= (CVar10._8_8_ & 0xffffffff);
      }
    }
  }
  return false;
}

Assistant:

bool PossibleContents::haveIntersection(const PossibleContents& a,
                                        const PossibleContents& b) {
  if (a.isNone() || b.isNone()) {
    // One is the empty set, so nothing can intersect here.
    return false;
  }

  if (a.isMany() || b.isMany()) {
    // One is the set of all things, so definitely something can intersect since
    // we've ruled out an empty set for both.
    return true;
  }

  auto aType = a.getType();
  auto bType = b.getType();

  if (!aType.isRef() || !bType.isRef()) {
    // At least one is not a reference. The only way they can intersect is if
    // the type is identical.
    return aType == bType;
  }

  // From here on we focus on references.

  auto aHeapType = aType.getHeapType();
  auto bHeapType = bType.getHeapType();

  if (aType.isNullable() && bType.isNullable() &&
      aHeapType.getBottom() == bHeapType.getBottom()) {
    // A compatible null is possible on both sides.
    return true;
  }

  // We ruled out having a compatible null on both sides. If one is simply a
  // null then no chance for an intersection remains.
  if (a.isNull() || b.isNull()) {
    return false;
  }

  auto aSubB = HeapType::isSubType(aHeapType, bHeapType);
  auto bSubA = HeapType::isSubType(bHeapType, aHeapType);
  if (!aSubB && !bSubA) {
    // No type can appear in both a and b, so the types differ, so the values
    // do not overlap.
    return false;
  }

  // From here on we focus on references and can ignore the case of null - any
  // intersection must be of a non-null value, so we can focus on the heap
  // types.

  auto aDepthFromRoot = aHeapType.getDepth();
  auto bDepthFromRoot = bHeapType.getDepth();

  if (aSubB) {
    // A is a subtype of B. For there to be an intersection we need their cones
    // to intersect, that is, to rule out the case where the cone from B is not
    // deep enough to reach A.
    assert(aDepthFromRoot >= bDepthFromRoot);
    return aDepthFromRoot - bDepthFromRoot <= b.getCone().depth;
  } else if (bSubA) {
    assert(bDepthFromRoot >= aDepthFromRoot);
    return bDepthFromRoot - aDepthFromRoot <= a.getCone().depth;
  } else {
    WASM_UNREACHABLE("we ruled out no subtyping before");
  }

  // TODO: we can also optimize things like different Literals, but existing
  //       passes do such things already so it is low priority.
}